

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

bool __thiscall qpdf::Array::erase(Array *this,int at)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  QPDF_Array *this_00;
  pointer pSVar4;
  pointer ppVar5;
  key_type *pkVar6;
  __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_b0;
  QPDFObjectHandle *local_a8;
  insert_return_type local_90;
  iterator local_68;
  const_iterator local_60;
  undefined1 local_58 [8];
  node_type nh;
  _Self local_38;
  iterator iter;
  iterator end;
  QPDF_Array *a;
  Array *pAStack_18;
  int at_local;
  Array *this_local;
  
  a._4_4_ = at;
  pAStack_18 = this;
  this_00 = array(this);
  iVar1 = a._4_4_;
  if ((a._4_4_ < 0) || (iVar3 = size(this), iVar3 <= iVar1)) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this_00);
    if (bVar2) {
      pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
               operator->(&this_00->sp);
      iter = std::
             map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
             ::end(&pSVar4->elements);
      pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
               operator->(&this_00->sp);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
           ::lower_bound(&pSVar4->elements,(key_type *)((long)&a + 4));
      bVar2 = std::operator!=(&local_38,&iter);
      if (bVar2) {
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator->
                           (&local_38);
        if (ppVar5->first == a._4_4_) {
          nh._M_pmapped =
               (__pointer<typename_pair<const_int,_QPDFObjectHandle>::second_type>)
               std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator++
                         (&local_38,0);
          pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                   operator->(&this_00->sp);
          std::
          map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::erase(&pSVar4->elements,(key_type *)((long)&a + 4));
        }
        while (bVar2 = std::operator!=(&local_38,&iter), bVar2) {
          pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                   operator->(&this_00->sp);
          local_68._M_node =
               (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator++
                         (&local_38,0);
          std::_Rb_tree_const_iterator<std::pair<const_int,_QPDFObjectHandle>_>::
          _Rb_tree_const_iterator(&local_60,&local_68);
          std::
          map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::extract((node_type *)local_58,&pSVar4->elements,local_60);
          pkVar6 = std::
                   _Node_handle<int,_std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                   ::key((node_type *)local_58);
          *pkVar6 = *pkVar6 + -1;
          pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                   operator->(&this_00->sp);
          std::
          map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::insert(&local_90,&pSVar4->elements,(node_type *)local_58);
          std::
          _Node_insert_return<std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>,_std::_Node_handle<int,_std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>_>
          ::~_Node_insert_return(&local_90);
          std::
          _Node_handle<int,_std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
          ::~_Node_handle((_Node_handle<int,_std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                           *)local_58);
        }
      }
      pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
               operator->(&this_00->sp);
      pSVar4->size = pSVar4->size + -1;
    }
    else {
      local_b0._M_current =
           (QPDFObjectHandle *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::cbegin
                     (&this_00->elements);
      local_a8 = (QPDFObjectHandle *)
                 __gnu_cxx::
                 __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator+(&local_b0,(long)a._4_4_);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::erase
                (&this_00->elements,(const_iterator)local_a8);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Array::erase(int at)
{
    auto a = array();
    if (at < 0 || at >= size()) {
        return false;
    }
    if (a->sp) {
        auto end = a->sp->elements.end();
        if (auto iter = a->sp->elements.lower_bound(at); iter != end) {
            if (iter->first == at) {
                iter++;
                a->sp->elements.erase(at);
            }

            while (iter != end) {
                auto nh = a->sp->elements.extract(iter++);
                --nh.key();
                a->sp->elements.insert(std::move(nh));
            }
        }
        --(a->sp->size);
    } else {
        a->elements.erase(a->elements.cbegin() + at);
    }
    return true;
}